

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_setglobals_unittest.cc
# Opt level: O0

void __thiscall
Test_SetGlobalValue_SetRootDirectory::Test_SetGlobalValue_SetRootDirectory
          (Test_SetGlobalValue_SetRootDirectory *this)

{
  value_type local_18;
  Test_SetGlobalValue_SetRootDirectory *local_10;
  Test_SetGlobalValue_SetRootDirectory *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(SetGlobalValue, SetRootDirectory) {
  // Test to see that the Template static variables get created when you
  // first call the static function Template::SetRootDirectory().
  Template::SetTemplateRootDirectory("/some/directory/path");
  // We don't know if we appended a / or a \, so we test indirectly
  EXPECT_EQ(strlen("/some/directory/path")+1,   // assert they added a char
            Template::template_root_directory().size());
  EXPECT_EQ(0, memcmp(Template::template_root_directory().c_str(),
                      "/some/directory/path",
                      strlen("/some/directory/path")));
}